

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleCalculateEdgeLogLikelihoodsByPartition
              (int instance,int *parentBufferIndices,int *childBufferIndices,int *probabilityIndices
              ,int *firstDerivativeIndices,int *secondDerivativeIndices,int *categoryWeightsIndices,
              int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
              int partitionCount,int count,double *outSumLogLikelihoodByPartition,
              double *outSumLogLikelihood,double *outSumFirstDerivativeByPartition,
              double *outSumFirstDerivative,double *outSumSecondDerivativeByPartition,
              double *outSumSecondDerivative)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x168))
                      (pBVar2,parentBufferIndices,childBufferIndices,probabilityIndices,
                       firstDerivativeIndices,secondDerivativeIndices);
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleCalculateEdgeLogLikelihoodsByPartition(int instance,
                                                 const int* parentBufferIndices,
                                                 const int* childBufferIndices,
                                                 const int* probabilityIndices,
                                                 const int* firstDerivativeIndices,
                                                 const int* secondDerivativeIndices,
                                                 const int* categoryWeightsIndices,
                                                 const int* stateFrequenciesIndices,
                                                 const int* cumulativeScaleIndices,
                                                 const int* partitionIndices,
                                                 int partitionCount,
                                                 int count,
                                                 double* outSumLogLikelihoodByPartition,
                                                 double* outSumLogLikelihood,
                                                 double* outSumFirstDerivativeByPartition,
                                                 double* outSumFirstDerivative,
                                                 double* outSumSecondDerivativeByPartition,
                                                 double* outSumSecondDerivative) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->calculateEdgeLogLikelihoodsByPartition(
                                                        parentBufferIndices,
                                                        childBufferIndices,
                                                        probabilityIndices,
                                                        firstDerivativeIndices,
                                                        secondDerivativeIndices,
                                                        categoryWeightsIndices,
                                                        stateFrequenciesIndices,
                                                        cumulativeScaleIndices,
                                                        partitionIndices,
                                                        partitionCount,
                                                        count,
                                                        outSumLogLikelihoodByPartition,
                                                        outSumLogLikelihood,
                                                        outSumFirstDerivativeByPartition,
                                                        outSumFirstDerivative,
                                                        outSumSecondDerivativeByPartition,
                                                        outSumSecondDerivative);
        DEBUG_END_TIME();

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
        union {double f; long l;} dfp;
        for(int i=0; i < partitionCount; i++) {
            dfp.f = outSumLogLikelihoodByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumLogLikelihoodByPartition[i] = dfp.f;
            dfp.f = outSumFirstDerivativeByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumFirstDerivativeByPartition[i] = dfp.f;
            dfp.f = outSumSecondDerivativeByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumSecondDerivativeByPartition[i] = dfp.f;
        }
        dfp.f = *outSumLogLikelihood;
        dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
        *outSumLogLikelihood = dfp.f;
#endif


        return returnValue;
//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }
}